

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::on_reply(upnp *this,socket_package *s,error_code *ec,size_t len)

{
  bool bVar1;
  int iVar2;
  pointer p_00;
  string *psVar3;
  ulong uVar4;
  size_type sVar5;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  endpoint *ep_02;
  endpoint *ep_03;
  endpoint *ep_04;
  endpoint *ep_05;
  endpoint *ep_06;
  endpoint *ep_07;
  error_code *ec_00;
  double dVar6;
  double __x;
  span<const_char> recv_buffer;
  pair<std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>,_bool> pVar7;
  anon_class_16_2_d7082ac2_for_m_fun f;
  string_view url_00;
  byte local_71a;
  undefined1 local_708 [68];
  int local_6c4;
  duration<long,_std::ratio<1L,_1L>_> local_6c0;
  duration local_6b8;
  tuple<std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>&,std::_Swallow_assign_const&>
  local_6b0 [16];
  _Base_ptr local_6a0;
  undefined1 local_698;
  pair<std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>,_bool> local_690;
  undefined1 local_680 [8];
  mapping_t m;
  global_mapping_t *j;
  iterator __end2;
  iterator __begin2;
  vector<global_mapping_t,_port_mapping_t> *__range2;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_588;
  undefined1 local_560 [16];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  undefined1 local_4c8 [8];
  error_code err;
  string auth;
  string protocol;
  _Self local_470;
  iterator i;
  rootdevice d;
  string_view local_350;
  string local_340 [8];
  string url;
  string local_300;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  span<const_char> local_298;
  undefined1 local_281 [8];
  bool error;
  http_parser p;
  string local_140;
  string local_120;
  address local_100;
  address local_e0;
  address local_c0;
  int local_a0;
  socket_package *local_90;
  upnp *local_88;
  undefined1 local_80 [8];
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
  reissue_receive;
  endpoint from;
  shared_ptr<libtorrent::upnp> me;
  size_t len_local;
  error_code *ec_local;
  socket_package *s_local;
  upnp *this_local;
  
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            ((error_code *)
             &me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             operation_aborted,(type *)0x0);
  bVar1 = boost::system::operator==
                    (ec,(error_code *)
                        &me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  if (bVar1) {
    return;
  }
  if ((this->m_closing & 1U) != 0) {
    return;
  }
  self((upnp *)((long)&from.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
  boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::udp> *)&reissue_receive.field_0x14,&s->remote);
  f.this = (upnp *)s;
  f.s = (socket_package *)this;
  local_90 = s;
  local_88 = this;
  libtorrent::aux::
  scope_end<libtorrent::upnp::on_reply(libtorrent::aux::socket_package&,boost::system::error_code_const&,unsigned_long)::__0>
            ((scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
              *)local_80,(aux *)s,f);
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    local_a0 = 1;
    goto LAB_0077bdd6;
  }
  bVar1 = libtorrent::aux::session_settings::get_bool(this->m_settings,0x8005);
  local_71a = 0;
  if (bVar1) {
    boost::asio::ip::address::address(&local_c0,&this->m_listen_address);
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::address
              (&local_e0,(basic_endpoint<boost::asio::ip::udp> *)&reissue_receive.field_0x14);
    boost::asio::ip::address::address(&local_100,&this->m_netmask);
    bVar1 = libtorrent::aux::match_addr_mask(&local_c0,&local_e0,&local_100);
    local_71a = bVar1 ^ 0xff;
  }
  if ((local_71a & 1) != 0) {
    bVar1 = should_log(this);
    if (bVar1) {
      libtorrent::aux::print_endpoint_abi_cxx11_(&local_120,(aux *)&reissue_receive.field_0x14,ep);
      ::std::__cxx11::string::c_str();
      boost::asio::ip::address_v4::to_string_abi_cxx11_(&local_140,&this->m_listen_address);
      ::std::__cxx11::string::c_str();
      boost::asio::ip::address_v4::to_string_abi_cxx11_
                ((string *)&p.m_connection_close,&this->m_netmask);
      dVar6 = (double)::std::__cxx11::string::c_str();
      log(this,dVar6);
      ::std::__cxx11::string::~string((string *)&p.m_connection_close);
      ::std::__cxx11::string::~string((string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_120);
    }
    local_a0 = 1;
    goto LAB_0077bdd6;
  }
  libtorrent::aux::http_parser::http_parser((http_parser *)(local_281 + 1),0);
  local_281[0] = 0;
  p_00 = ::std::array<char,_1500UL>::data(&s->buffer);
  span<const_char>::span(&local_298,p_00,len);
  ec_00 = (error_code *)local_281;
  recv_buffer.m_len = (difference_type)local_298.m_ptr;
  recv_buffer.m_ptr = local_281 + 1;
  libtorrent::aux::http_parser::incoming
            ((http_parser *)local_2a0,recv_buffer,(bool *)local_298.m_len);
  if ((local_281[0] & 1) == 0) {
    iVar2 = libtorrent::aux::http_parser::status_code((http_parser *)(local_281 + 1));
    if (iVar2 != 200) {
      psVar3 = libtorrent::aux::http_parser::method_abi_cxx11_((http_parser *)(local_281 + 1));
      bVar1 = ::std::operator!=(psVar3,"notify");
      if (bVar1) {
        bVar1 = should_log(this);
        if (bVar1) {
          libtorrent::aux::http_parser::method_abi_cxx11_((http_parser *)(local_281 + 1));
          uVar4 = ::std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            libtorrent::aux::http_parser::method_abi_cxx11_((http_parser *)(local_281 + 1));
            ::std::__cxx11::string::c_str();
            libtorrent::aux::print_endpoint_abi_cxx11_
                      (&local_300,(aux *)&reissue_receive.field_0x14,ep_02);
            dVar6 = (double)::std::__cxx11::string::c_str();
            log(this,dVar6);
            ::std::__cxx11::string::~string((string *)&local_300);
          }
          else {
            libtorrent::aux::http_parser::status_code((http_parser *)(local_281 + 1));
            libtorrent::aux::print_endpoint_abi_cxx11_
                      (&local_2e0,(aux *)&reissue_receive.field_0x14,ep_01);
            dVar6 = (double)::std::__cxx11::string::c_str();
            log(this,dVar6);
            ::std::__cxx11::string::~string((string *)&local_2e0);
          }
        }
        local_a0 = 1;
        goto LAB_0077bdca;
      }
    }
    bVar1 = libtorrent::aux::http_parser::header_finished((http_parser *)(local_281 + 1));
    if (bVar1) {
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_350,"location");
      psVar3 = libtorrent::aux::http_parser::header_abi_cxx11_
                         ((http_parser *)(local_281 + 1),local_350);
      ::std::__cxx11::string::string(local_340,(string *)psVar3);
      uVar4 = ::std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        rootdevice::rootdevice((rootdevice *)&i);
        ::std::__cxx11::string::operator=((string *)&i,local_340);
        local_470._M_node =
             (_Base_ptr)
             ::std::
             set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
             ::find(&this->m_devices,(key_type *)&i);
        protocol.field_2._8_8_ =
             ::std::
             set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
             ::end(&this->m_devices);
        bVar1 = ::std::operator==(&local_470,(_Self *)((long)&protocol.field_2 + 8));
        if (bVar1) {
          ::std::__cxx11::string::string((string *)(auth.field_2._M_local_buf + 8));
          ::std::__cxx11::string::string((string *)&err.cat_);
          boost::system::error_code::error_code((error_code *)local_4c8);
          local_560 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&i);
          url_00._M_len = local_560._8_8_;
          url_00._M_str = (char *)local_4c8;
          libtorrent::aux::parse_url_components_abi_cxx11_(&local_550,local_560._0_8_,url_00,ec_00);
          ::std::
          tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
                    (&local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&auth.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err.cat_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &d.mapping.
                      super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                      .
                      super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (int *)(d.hostname.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d.port);
          ::std::
          tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
          ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
                       *)&local_588,&local_550);
          ::std::
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~tuple(&local_550);
          if (d.hostname.field_2._8_4_ == -1) {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&auth.field_2 + 8),"http");
            d.hostname.field_2._8_4_ = 0x1bb;
            if (bVar1) {
              d.hostname.field_2._8_4_ = 0x50;
            }
          }
          bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_4c8);
          if (bVar1) {
            bVar1 = should_log(this);
            if (bVar1) {
              ::std::__cxx11::string::c_str();
              libtorrent::aux::print_endpoint_abi_cxx11_
                        (&local_5a8,(aux *)&reissue_receive.field_0x14,ep_05);
              ::std::__cxx11::string::c_str();
              boost::system::error_code::message_abi_cxx11_(&local_5c8,(error_code *)local_4c8);
              dVar6 = (double)::std::__cxx11::string::c_str();
              log(this,dVar6);
              ::std::__cxx11::string::~string((string *)&local_5c8);
              ::std::__cxx11::string::~string((string *)&local_5a8);
            }
            local_a0 = 1;
          }
          else {
            bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&auth.field_2 + 8),"http");
            if (bVar1) {
              bVar1 = should_log(this);
              if (bVar1) {
                ::std::__cxx11::string::c_str();
                libtorrent::aux::print_endpoint_abi_cxx11_
                          (&local_5e8,(aux *)&reissue_receive.field_0x14,ep_06);
                dVar6 = (double)::std::__cxx11::string::c_str();
                log(this,dVar6);
                ::std::__cxx11::string::~string((string *)&local_5e8);
              }
              local_a0 = 1;
            }
            else if (d.hostname.field_2._8_4_ == 0) {
              bVar1 = should_log(this);
              if (bVar1) {
                libtorrent::aux::print_endpoint_abi_cxx11_
                          ((string *)&__range2,(aux *)&reissue_receive.field_0x14,ep_07);
                dVar6 = (double)::std::__cxx11::string::c_str();
                log(this,dVar6);
                ::std::__cxx11::string::~string((string *)&__range2);
              }
              local_a0 = 1;
            }
            else {
              bVar1 = should_log(this);
              if (bVar1) {
                ::std::__cxx11::string::c_str();
                ::std::
                set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                ::size(&this->m_devices);
                log(this,__x);
              }
              sVar5 = ::std::
                      set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                      ::size(&this->m_devices);
              if (sVar5 < 0x32) {
                __end2 = ::std::
                         vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                         ::begin(&(this->m_mappings).
                                  super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                );
                j = (global_mapping_t *)
                    ::std::
                    vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                    ::end(&(this->m_mappings).
                           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                         );
                while( true ) {
                  bVar1 = __gnu_cxx::operator!=
                                    (&__end2,(__normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
                                              *)&j);
                  if (!bVar1) break;
                  m._80_8_ = __gnu_cxx::
                             __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
                             ::operator*(&__end2);
                  mapping_t::mapping_t((mapping_t *)local_680);
                  m.super_base_mapping.expires.__d.__r._0_1_ = 1;
                  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
                            ((basic_endpoint<boost::asio::ip::tcp> *)
                             &m.super_base_mapping.external_port,
                             (basic_endpoint<boost::asio::ip::tcp> *)(m._80_8_ + 8));
                  ::std::__cxx11::string::operator=
                            ((string *)&m.field_0x28,(string *)(m._80_8_ + 0x28));
                  m.super_base_mapping.expires.__d.__r._4_4_ = *(undefined4 *)(m._80_8_ + 4);
                  m.super_base_mapping.act = *(portmap_action *)m._80_8_;
                  ::std::
                  vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                  ::push_back((vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                               *)((long)&d.service_namespace.field_2 + 8),(value_type *)local_680);
                  mapping_t::~mapping_t((mapping_t *)local_680);
                  __gnu_cxx::
                  __normal_iterator<libtorrent::upnp::global_mapping_t_*,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
                  ::operator++(&__end2);
                }
                pVar7 = ::std::
                        set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                        ::insert(&this->m_devices,(value_type *)&i);
                local_6a0 = (_Base_ptr)pVar7.first._M_node;
                local_698 = pVar7.second;
                local_690.first._M_node = local_6a0;
                local_690.second = (bool)local_698;
                ::std::
                tie<std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>,std::_Swallow_assign_const>
                          ((_Rb_tree_const_iterator<libtorrent::upnp::rootdevice> *)local_6b0,
                           (_Swallow_assign *)&local_470);
                ::std::
                tuple<std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>&,std::_Swallow_assign_const&>
                ::operator=(local_6b0,&local_690);
                local_a0 = 0;
              }
              else {
                bVar1 = should_log(this);
                if (bVar1) {
                  ::std::
                  set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                  ::size(&this->m_devices);
                  dVar6 = (double)::std::__cxx11::string::c_str();
                  log(this,dVar6);
                }
                local_a0 = 1;
              }
            }
          }
          ::std::__cxx11::string::~string((string *)&err.cat_);
          ::std::__cxx11::string::~string((string *)(auth.field_2._M_local_buf + 8));
          if (local_a0 == 0) goto LAB_0077bca9;
        }
        else {
LAB_0077bca9:
          try_map_upnp(this);
          local_6c4 = 1;
          ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)&local_6c0,&local_6c4);
          ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::
          duration<long,std::ratio<1l,1l>,void>
                    ((duration<long,std::ratio<1l,1000000000l>> *)&local_6b8,&local_6c0);
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ::expires_after(&this->m_map_timer,&local_6b8);
          local_708._16_8_ = map_timer;
          local_708._24_8_ = (pointer)0x0;
          self((upnp *)local_708);
          ::std::
          bind<void(libtorrent::upnp::*)(boost::system::error_code_const&),std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>const&>
                    ((type *)(local_708 + 0x20),(offset_in_upnp_to_subr *)(local_708 + 0x10),
                     (shared_ptr<libtorrent::upnp> *)local_708,
                     (_Placeholder<1> *)&::std::placeholders::_1);
          boost::asio::
          basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
          ::
          async_wait<std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                    ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                      *)&this->m_map_timer,
                     (_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                      *)(local_708 + 0x20));
          ::std::
          _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          ::~_Bind((_Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
                    *)(local_708 + 0x20));
          ::std::shared_ptr<libtorrent::upnp>::~shared_ptr
                    ((shared_ptr<libtorrent::upnp> *)local_708);
          local_a0 = 0;
        }
        rootdevice::~rootdevice((rootdevice *)&i);
      }
      else {
        bVar1 = should_log(this);
        if (bVar1) {
          libtorrent::aux::print_endpoint_abi_cxx11_
                    ((string *)
                     &d.upnp_connection.
                      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(aux *)&reissue_receive.field_0x14,ep_04);
          dVar6 = (double)::std::__cxx11::string::c_str();
          log(this,dVar6);
          ::std::__cxx11::string::~string
                    ((string *)
                     &d.upnp_connection.
                      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        local_a0 = 1;
      }
      ::std::__cxx11::string::~string(local_340);
    }
    else {
      bVar1 = should_log(this);
      if (bVar1) {
        libtorrent::aux::print_endpoint_abi_cxx11_
                  ((string *)((long)&url.field_2 + 8),(aux *)&reissue_receive.field_0x14,ep_03);
        dVar6 = (double)::std::__cxx11::string::c_str();
        log(this,dVar6);
        ::std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
      }
      local_a0 = 1;
    }
  }
  else {
    bVar1 = should_log(this);
    if (bVar1) {
      libtorrent::aux::print_endpoint_abi_cxx11_
                (&local_2c0,(aux *)&reissue_receive.field_0x14,ep_00);
      dVar6 = (double)::std::__cxx11::string::c_str();
      log(this,dVar6);
      ::std::__cxx11::string::~string((string *)&local_2c0);
    }
    local_a0 = 1;
  }
LAB_0077bdca:
  libtorrent::aux::http_parser::~http_parser((http_parser *)(local_281 + 1));
LAB_0077bdd6:
  libtorrent::aux::
  scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/upnp.cpp:481:35)>
  ::~scope_end_impl((scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_upnp_cpp:481:35)>
                     *)local_80);
  ::std::shared_ptr<libtorrent::upnp>::~shared_ptr
            ((shared_ptr<libtorrent::upnp> *)((long)&from.impl_.data_.v6.sin6_addr.__in6_u + 0xc));
  return;
}

Assistant:

void upnp::on_reply(aux::socket_package& s, error_code const& ec, std::size_t const len)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::on_reply");

	if (ec == boost::asio::error::operation_aborted) return;
	if (m_closing) return;

	std::shared_ptr<upnp> me(self());
	udp::endpoint const from = s.remote;
	// parse out the url for the device

/*
	the response looks like this:

	HTTP/1.1 200 OK
	ST:upnp:rootdevice
	USN:uuid:000f-66d6-7296000099dc::upnp:rootdevice
	Location: http://192.168.1.1:5431/dyndev/uuid:000f-66d6-7296000099dc
	Server: Custom/1.0 UPnP/1.0 Proc/Ver
	EXT:
	Cache-Control:max-age=180
	DATE: Fri, 02 Jan 1970 08:10:38 GMT

	a notification looks like this:

	NOTIFY * HTTP/1.1
	Host:239.255.255.250:1900
	NT:urn:schemas-upnp-org:device:MediaServer:1
	NTS:ssdp:alive
	Location:http://10.0.3.169:2869/upnphost/udhisapi.dll?content=uuid:c17f0c32-d19b-4938-ae94-65f945c3a26e
	USN:uuid:c17f0c32-d19b-4938-ae94-65f945c3a26e::urn:schemas-upnp-org:device:MediaServer:1
	Cache-Control:max-age=900
	Server:Microsoft-Windows-NT/5.1 UPnP/1.0 UPnP-Device-Host/1.0

*/

	// reissue the async receive as we exit the function. We can't do this
	// earlier because we still need to use s.buffer
	auto reissue_receive = scope_end([&] {
		ADD_OUTSTANDING_ASYNC("upnp::on_reply");
		s.socket.async_receive_from(boost::asio::buffer(s.buffer), s.remote
			, std::bind(&upnp::on_reply, self(), std::ref(s), _1, _2));
	});

	if (ec) return;

	if (m_settings.get_bool(settings_pack::upnp_ignore_nonrouters)
		&& !match_addr_mask(m_listen_address, from.address(), m_netmask))
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("ignoring response from: %s. IP is not on local network. (addr: %s mask: %s)"
				, print_endpoint(from).c_str()
				, m_listen_address.to_string().c_str()
				, m_netmask.to_string().c_str());
		}
#endif
		return;
	}

	aux::http_parser p;
	bool error = false;
	p.incoming({s.buffer.data(), std::ptrdiff_t(len)}, error);
	if (error)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("received malformed HTTP from: %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	if (p.status_code() != 200 && p.method() != "notify")
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			if (p.method().empty())
			{
				log("HTTP status %u from %s"
					, p.status_code(), print_endpoint(from).c_str());
			}
			else
			{
				log("HTTP method %s from %s"
					, p.method().c_str(), print_endpoint(from).c_str());
			}
		}
#endif
		return;
	}

	if (!p.header_finished())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("incomplete HTTP packet from %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	std::string url = p.header("location");
	if (url.empty())
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("missing location header from %s"
				, print_endpoint(from).c_str());
		}
#endif
		return;
	}

	rootdevice d;
	d.url = url;

	auto i = m_devices.find(d);

	if (i == m_devices.end())
	{
		std::string protocol;
		std::string auth;
		error_code err;
		// we don't have this device in our list. Add it
		std::tie(protocol, auth, d.hostname, d.port, d.path)
			= parse_url_components(d.url, err);
		if (d.port == -1) d.port = protocol == "http" ? 80 : 443;

		if (err)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("invalid URL %s from %s: %s"
					, d.url.c_str(), print_endpoint(from).c_str(), err.message().c_str());
			}
#endif
			return;
		}

		// ignore the auth here. It will be re-parsed
		// by the http connection later

		if (protocol != "http")
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("unsupported protocol %s from %s"
					, protocol.c_str(), print_endpoint(from).c_str());
			}
#endif
			return;
		}

		if (d.port == 0)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("URL with port 0 from %s", print_endpoint(from).c_str());
			}
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("found rootdevice: %s (%d)"
				, d.url.c_str(), int(m_devices.size()));
		}
#endif

		if (m_devices.size() >= 50)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				log("too many rootdevices: (%d). Ignoring %s"
					, int(m_devices.size()), d.url.c_str());
			}
#endif
			return;
		}

		TORRENT_ASSERT(d.mapping.empty());
		for (auto const& j : m_mappings)
		{
			mapping_t m;
			m.act = portmap_action::add;
			m.local_ep = j.local_ep;
			m.device = j.device;
			m.external_port = j.external_port;
			m.protocol = j.protocol;
			d.mapping.push_back(m);
		}
		std::tie(i, std::ignore) = m_devices.insert(d);
	}


	// iterate over the devices we know and connect and issue the mappings
	try_map_upnp();

	// check back in a little bit to see if we have seen any
	// devices at one of our default routes. If not, we want to override
	// ignoring them and use them instead (better than not working).
	m_map_timer.expires_after(seconds(1));
	ADD_OUTSTANDING_ASYNC("upnp::map_timer");
	m_map_timer.async_wait(std::bind(&upnp::map_timer, self(), _1));
}